

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_sqrt_sort_merge_buffers_left_with_x_buf
               (int *keys,int midkey,int **arr,int nblock,int lblock,int nblock2,int llast)

{
  int in_ECX;
  int **in_RDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int fnext;
  int cidx;
  int pidx;
  int frest;
  int lrest;
  int prest;
  int l;
  int local_3c;
  int local_38;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int **local_18;
  int local_c;
  int *local_8;
  
  if (in_ECX == 0) {
    local_28 = in_R9D * in_R8D;
    stable_sqrt_sort_merge_left_with_x_buf(in_RDX,local_28,fnext,-in_R8D);
  }
  else {
    local_34 = (uint)(in_ESI <= *in_RDI);
    local_38 = in_R8D;
    local_30 = in_R8D;
    local_24 = in_R9D;
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    for (local_3c = 1; local_3c < local_1c; local_3c = local_3c + 1) {
      local_2c = local_38 - local_30;
      if (local_c <= local_8[local_3c] == local_34) {
        memcpy(local_18 + ((long)local_2c - (long)local_20),local_18 + local_2c,(long)local_30 << 3)
        ;
        local_30 = local_20;
      }
      else {
        stable_sqrt_sort_smart_merge_with_x_buf
                  (local_18 + local_2c,&local_30,(int *)&local_34,local_20,local_20);
      }
      local_38 = local_20 + local_38;
    }
    local_2c = local_38 - local_30;
    if (fnext == 0) {
      memcpy(local_18 + ((long)local_2c - (long)local_20),local_18 + local_2c,(long)local_30 << 3);
    }
    else {
      if (local_34 == 0) {
        local_30 = local_20 * local_24 + local_30;
      }
      else {
        memcpy(local_18 + ((long)local_2c - (long)local_20),local_18 + local_2c,(long)local_30 << 3)
        ;
        local_2c = local_38;
        local_30 = local_20 * local_24;
        local_34 = 0;
      }
      stable_sqrt_sort_merge_left_with_x_buf(local_18 + local_2c,local_30,fnext,-local_20);
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_MERGE_BUFFERS_LEFT_WITH_X_BUF(int *keys, int midkey,
                                                    SORT_TYPE *arr, int nblock,
                                                    int lblock, int nblock2,
                                                    int llast) {
  int l, prest, lrest, frest, pidx, cidx, fnext;

  if (nblock == 0) {
    l = nblock2 * lblock;
    SQRT_SORT_MERGE_LEFT_WITH_X_BUF(arr, l, llast, -lblock);
    return;
  }

  lrest = lblock;
  frest = keys[0] < midkey ? 0 : 1;
  pidx = lblock;

  for (cidx = 1; cidx < nblock; cidx++, pidx += lblock) {
    prest = pidx - lrest;
    fnext = keys[cidx] < midkey ? 0 : 1;

    if (fnext == frest) {
      SORT_TYPE_CPY(arr + prest - lblock, arr + prest, lrest);
      prest = pidx;
      lrest = lblock;
    } else {
      SQRT_SORT_SMART_MERGE_WITH_X_BUF(arr + prest, &lrest, &frest, lblock,
                                       lblock);
    }
  }

  prest = pidx - lrest;

  if (llast) {
    if (frest) {
      SORT_TYPE_CPY(arr + prest - lblock, arr + prest, lrest);
      prest = pidx;
      lrest = lblock * nblock2;
      frest = 0;
    } else {
      lrest += lblock * nblock2;
    }

    SQRT_SORT_MERGE_LEFT_WITH_X_BUF(arr + prest, lrest, llast, -lblock);
  } else {
    SORT_TYPE_CPY(arr + prest - lblock, arr + prest, lrest);
  }
}